

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O0

void stbi__idct_simd(stbi_uc *out,int out_stride,short *data)

{
  char cVar1;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  stbi_uc *psVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar102;
  int iVar113;
  int iVar115;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  int iVar103;
  int iVar114;
  int iVar116;
  int iVar117;
  int iVar118;
  undefined1 auVar112 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  __m128i p3;
  __m128i p2;
  __m128i p1;
  __m128i p0;
  __m128i dif_h_7;
  __m128i dif_l_7;
  __m128i sum_h_7;
  __m128i sum_l_7;
  __m128i abiased_h_7;
  __m128i abiased_l_7;
  __m128i dif_h_6;
  __m128i dif_l_6;
  __m128i sum_h_6;
  __m128i sum_l_6;
  __m128i abiased_h_6;
  __m128i abiased_l_6;
  __m128i dif_h_5;
  __m128i dif_l_5;
  __m128i sum_h_5;
  __m128i sum_l_5;
  __m128i abiased_h_5;
  __m128i abiased_l_5;
  __m128i dif_h_4;
  __m128i dif_l_4;
  __m128i sum_h_4;
  __m128i sum_l_4;
  __m128i abiased_h_4;
  __m128i abiased_l_4;
  __m128i x7_h_1;
  __m128i x7_l_1;
  __m128i x6_h_1;
  __m128i x6_l_1;
  __m128i x5_h_1;
  __m128i x5_l_1;
  __m128i x4_h_1;
  __m128i x4_l_1;
  __m128i y5o_h_1;
  __m128i y5o_l_1;
  __m128i y4o_h_1;
  __m128i y4o_l_1;
  __m128i rot1_0hi_1;
  __m128i rot1_0lo_1;
  __m128i sum35_1;
  __m128i sum17_1;
  __m128i y3o_h_1;
  __m128i y3o_l_1;
  __m128i y1o_h_1;
  __m128i y1o_l_1;
  __m128i rot3_0hi_1;
  __m128i rot3_0lo_1;
  __m128i y2o_h_1;
  __m128i y2o_l_1;
  __m128i y0o_h_1;
  __m128i y0o_l_1;
  __m128i rot2_0hi_1;
  __m128i rot2_0lo_1;
  __m128i x2_h_1;
  __m128i x2_l_1;
  __m128i x1_h_1;
  __m128i x1_l_1;
  __m128i x3_h_1;
  __m128i x3_l_1;
  __m128i x0_h_1;
  __m128i x0_l_1;
  __m128i t1e_h_1;
  __m128i t1e_l_1;
  __m128i t0e_h_1;
  __m128i t0e_l_1;
  __m128i dif04_1;
  __m128i sum04_1;
  __m128i t3e_h_1;
  __m128i t3e_l_1;
  __m128i t2e_h_1;
  __m128i t2e_l_1;
  __m128i rot0_0hi_1;
  __m128i rot0_0lo_1;
  __m128i dif_h_3;
  __m128i dif_l_3;
  __m128i sum_h_3;
  __m128i sum_l_3;
  __m128i abiased_h_3;
  __m128i abiased_l_3;
  __m128i dif_h_2;
  __m128i dif_l_2;
  __m128i sum_h_2;
  __m128i sum_l_2;
  __m128i abiased_h_2;
  __m128i abiased_l_2;
  __m128i dif_h_1;
  __m128i dif_l_1;
  __m128i sum_h_1;
  __m128i sum_l_1;
  __m128i abiased_h_1;
  __m128i abiased_l_1;
  __m128i dif_h;
  __m128i dif_l;
  __m128i sum_h;
  __m128i sum_l;
  __m128i abiased_h;
  __m128i abiased_l;
  __m128i x7_h;
  __m128i x7_l;
  __m128i x6_h;
  __m128i x6_l;
  __m128i x5_h;
  __m128i x5_l;
  __m128i x4_h;
  __m128i x4_l;
  __m128i y5o_h;
  __m128i y5o_l;
  __m128i y4o_h;
  __m128i y4o_l;
  __m128i rot1_0hi;
  __m128i rot1_0lo;
  __m128i sum35;
  __m128i sum17;
  __m128i y3o_h;
  __m128i y3o_l;
  __m128i y1o_h;
  __m128i y1o_l;
  __m128i rot3_0hi;
  __m128i rot3_0lo;
  __m128i y2o_h;
  __m128i y2o_l;
  __m128i y0o_h;
  __m128i y0o_l;
  __m128i rot2_0hi;
  __m128i rot2_0lo;
  __m128i x2_h;
  __m128i x2_l;
  __m128i x1_h;
  __m128i x1_l;
  __m128i x3_h;
  __m128i x3_l;
  __m128i x0_h;
  __m128i x0_l;
  __m128i t1e_h;
  __m128i t1e_l;
  __m128i t0e_h;
  __m128i t0e_l;
  __m128i dif04;
  __m128i sum04;
  __m128i t3e_h;
  __m128i t3e_l;
  __m128i t2e_h;
  __m128i t2e_l;
  __m128i rot0_0hi;
  __m128i rot0_0lo;
  __m128i bias_1;
  __m128i bias_0;
  __m128i rot3_1;
  __m128i rot3_0;
  __m128i rot2_1;
  __m128i rot2_0;
  __m128i rot1_1;
  __m128i rot1_0;
  __m128i rot0_1;
  __m128i rot0_0;
  __m128i tmp;
  __m128i row7;
  __m128i row6;
  __m128i row5;
  __m128i row4;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  short *data_local;
  int out_stride_local;
  stbi_uc *out_local;
  short local_1f08;
  short sStack_1f06;
  undefined2 uStack_1f04;
  short sStack_1f02;
  short local_1ef8;
  short sStack_1ef6;
  undefined2 uStack_1ef4;
  short sStack_1ef2;
  short local_1ee8;
  short sStack_1ee6;
  undefined2 uStack_1ee4;
  short sStack_1ee2;
  short local_1ed8;
  short sStack_1ed6;
  undefined2 uStack_1ed4;
  short sStack_1ed2;
  short local_1ec8;
  short sStack_1ec6;
  undefined2 uStack_1ec4;
  short sStack_1ec2;
  short local_1eb8;
  short sStack_1eb6;
  undefined2 uStack_1eb4;
  short sStack_1eb2;
  short local_1ea8;
  short sStack_1ea6;
  undefined2 uStack_1ea4;
  short sStack_1ea2;
  short local_1e98;
  short sStack_1e96;
  undefined2 uStack_1e94;
  short sStack_1e92;
  short local_1e68;
  short sStack_1e66;
  short sStack_1e64;
  short sStack_1e62;
  short local_1e58;
  short sStack_1e56;
  short sStack_1e54;
  short sStack_1e52;
  short local_1e48;
  short sStack_1e46;
  short sStack_1e44;
  short sStack_1e42;
  short local_1e38;
  short sStack_1e36;
  short sStack_1e34;
  short sStack_1e32;
  undefined2 local_1de8;
  undefined2 uStack_1de6;
  undefined2 uStack_1de4;
  undefined2 uStack_1de2;
  undefined2 local_1dd8;
  undefined2 uStack_1dd6;
  undefined2 uStack_1dd4;
  undefined2 uStack_1dd2;
  short sStack_1c00;
  short sStack_1bfe;
  undefined2 uStack_1bfc;
  short sStack_1bfa;
  short sStack_1bf0;
  short sStack_1bee;
  undefined2 uStack_1bec;
  short sStack_1be0;
  short sStack_1bde;
  undefined2 uStack_1bdc;
  short sStack_1bda;
  short sStack_1bd0;
  short sStack_1bce;
  undefined2 uStack_1bcc;
  short sStack_1bc0;
  short sStack_1bbe;
  undefined2 uStack_1bbc;
  short sStack_1bba;
  short sStack_1bb0;
  short sStack_1bae;
  undefined2 uStack_1bac;
  short sStack_1ba0;
  short sStack_1b9e;
  undefined2 uStack_1b9c;
  short sStack_1b9a;
  short sStack_1b90;
  short sStack_1b8e;
  undefined2 uStack_1b8c;
  short sStack_1b60;
  short sStack_1b5e;
  short sStack_1b5c;
  short sStack_1b5a;
  short sStack_1b50;
  short sStack_1b4e;
  short sStack_1b4c;
  short sStack_1b4a;
  short sStack_1b40;
  short sStack_1b3e;
  short sStack_1b3c;
  short sStack_1b3a;
  short sStack_1b30;
  short sStack_1b2e;
  short sStack_1b2c;
  short sStack_1b2a;
  undefined2 uStack_1ae0;
  undefined2 uStack_1ade;
  undefined2 uStack_1adc;
  undefined2 uStack_1ada;
  undefined2 uStack_1ad0;
  undefined2 uStack_1ace;
  undefined2 uStack_1acc;
  undefined2 uStack_1aca;
  short local_1628;
  short sStack_1626;
  short sStack_1624;
  short sStack_1622;
  short sStack_1620;
  short sStack_161e;
  short sStack_161c;
  short sStack_161a;
  short local_1618;
  short sStack_1616;
  short sStack_1614;
  short sStack_1612;
  short sStack_1610;
  short sStack_160e;
  short sStack_160c;
  short sStack_160a;
  int local_13b8;
  int iStack_13b4;
  int iStack_13b0;
  int iStack_13ac;
  int local_1398;
  int iStack_1394;
  int iStack_1390;
  int iStack_138c;
  int local_1378;
  int iStack_1374;
  int iStack_1370;
  int iStack_136c;
  int local_1358;
  int iStack_1354;
  int iStack_1350;
  int iStack_134c;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  int local_1118;
  int iStack_1114;
  int iStack_1110;
  int iStack_110c;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  int local_10d8;
  int iStack_10d4;
  int iStack_10d0;
  int iStack_10cc;
  int local_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int local_e18;
  int iStack_e14;
  int iStack_e10;
  int iStack_e0c;
  int local_df8;
  int iStack_df4;
  int iStack_df0;
  int iStack_dec;
  int local_dd8;
  int iStack_dd4;
  int iStack_dd0;
  int iStack_dcc;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  int local_db8;
  int iStack_db4;
  int iStack_db0;
  int iStack_dac;
  int local_da8;
  int iStack_da4;
  int iStack_da0;
  int iStack_d9c;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  int local_d78;
  int iStack_d74;
  int iStack_d70;
  int iStack_d6c;
  int local_d68;
  int iStack_d64;
  int iStack_d60;
  int iStack_d5c;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  int local_d48;
  int iStack_d44;
  int iStack_d40;
  int iStack_d3c;
  int local_d28;
  int iStack_d24;
  int iStack_d20;
  int iStack_d1c;
  int local_d08;
  int iStack_d04;
  int iStack_d00;
  int iStack_cfc;
  int local_ce8;
  int iStack_ce4;
  int iStack_ce0;
  int iStack_cdc;
  int local_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int local_a98;
  int iStack_a94;
  int iStack_a90;
  int iStack_a8c;
  int local_a78;
  int iStack_a74;
  int iStack_a70;
  int iStack_a6c;
  int local_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  int local_a48;
  int iStack_a44;
  int iStack_a40;
  int iStack_a3c;
  int local_a38;
  int iStack_a34;
  int iStack_a30;
  int iStack_a2c;
  int local_a28;
  int iStack_a24;
  int iStack_a20;
  int iStack_a1c;
  int local_a18;
  int iStack_a14;
  int iStack_a10;
  int iStack_a0c;
  int local_a08;
  int iStack_a04;
  int iStack_a00;
  int iStack_9fc;
  int local_9f8;
  int iStack_9f4;
  int iStack_9f0;
  int iStack_9ec;
  int local_9e8;
  int iStack_9e4;
  int iStack_9e0;
  int iStack_9dc;
  int local_9d8;
  int iStack_9d4;
  int iStack_9d0;
  int iStack_9cc;
  int local_9c8;
  int iStack_9c4;
  int iStack_9c0;
  int iStack_9bc;
  int local_9a8;
  int iStack_9a4;
  int iStack_9a0;
  int iStack_99c;
  int local_988;
  int iStack_984;
  int iStack_980;
  int iStack_97c;
  int local_968;
  int iStack_964;
  int iStack_960;
  int iStack_95c;
  short local_448;
  short sStack_446;
  short sStack_444;
  short sStack_442;
  short sStack_440;
  short sStack_43e;
  short sStack_43c;
  short sStack_43a;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_418;
  short sStack_416;
  short sStack_414;
  short sStack_412;
  short sStack_410;
  short sStack_40e;
  short sStack_40c;
  short sStack_40a;
  short local_408;
  short sStack_406;
  short sStack_404;
  short sStack_402;
  short sStack_400;
  short sStack_3fe;
  short sStack_3fc;
  short sStack_3fa;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short local_3e8;
  short sStack_3e6;
  short sStack_3e4;
  short sStack_3e2;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  char cVar2;
  char cVar3;
  char cVar4;
  
  uVar5 = *(undefined8 *)data;
  uVar6 = *(undefined8 *)(data + 4);
  uVar7 = *(undefined8 *)(data + 8);
  uVar8 = *(undefined8 *)(data + 0xc);
  uVar9 = *(undefined8 *)(data + 0x10);
  uVar10 = *(undefined8 *)(data + 0x14);
  uVar11 = *(undefined8 *)(data + 0x18);
  uVar12 = *(undefined8 *)(data + 0x1c);
  uVar13 = *(undefined8 *)(data + 0x20);
  uVar14 = *(undefined8 *)(data + 0x24);
  uVar15 = *(undefined8 *)(data + 0x28);
  uVar16 = *(undefined8 *)(data + 0x2c);
  uVar17 = *(undefined8 *)(data + 0x30);
  uVar18 = *(undefined8 *)(data + 0x34);
  uVar19 = *(undefined8 *)(data + 0x38);
  uVar20 = *(undefined8 *)(data + 0x3c);
  local_1dd8 = (undefined2)uVar9;
  uStack_1dd6 = (undefined2)((ulong)uVar9 >> 0x10);
  uStack_1dd4 = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_1dd2 = (undefined2)((ulong)uVar9 >> 0x30);
  local_1de8 = (undefined2)uVar17;
  uStack_1de6 = (undefined2)((ulong)uVar17 >> 0x10);
  uStack_1de4 = (undefined2)((ulong)uVar17 >> 0x20);
  uStack_1de2 = (undefined2)((ulong)uVar17 >> 0x30);
  uStack_1ad0 = (undefined2)uVar10;
  uStack_1ace = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_1acc = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_1aca = (undefined2)((ulong)uVar10 >> 0x30);
  uStack_1ae0 = (undefined2)uVar18;
  uStack_1ade = (undefined2)((ulong)uVar18 >> 0x10);
  uStack_1adc = (undefined2)((ulong)uVar18 >> 0x20);
  uStack_1ada = (undefined2)((ulong)uVar18 >> 0x30);
  auVar60._2_2_ = local_1de8;
  auVar60._0_2_ = local_1dd8;
  auVar60._4_2_ = uStack_1dd6;
  auVar60._6_2_ = uStack_1de6;
  auVar60._10_2_ = uStack_1de4;
  auVar60._8_2_ = uStack_1dd4;
  auVar60._12_2_ = uStack_1dd2;
  auVar60._14_2_ = uStack_1de2;
  auVar59._8_8_ = 0xeb1a08a9eb1a08a9;
  auVar59._0_8_ = 0xeb1a08a9eb1a08a9;
  auVar94 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_1ae0;
  auVar58._0_2_ = uStack_1ad0;
  auVar58._4_2_ = uStack_1ace;
  auVar58._6_2_ = uStack_1ade;
  auVar58._10_2_ = uStack_1adc;
  auVar58._8_2_ = uStack_1acc;
  auVar58._12_2_ = uStack_1aca;
  auVar58._14_2_ = uStack_1ada;
  auVar57._8_8_ = 0xeb1a08a9eb1a08a9;
  auVar57._0_8_ = 0xeb1a08a9eb1a08a9;
  auVar95 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = local_1de8;
  auVar56._0_2_ = local_1dd8;
  auVar56._4_2_ = uStack_1dd6;
  auVar56._6_2_ = uStack_1de6;
  auVar56._10_2_ = uStack_1de4;
  auVar56._8_2_ = uStack_1dd4;
  auVar56._12_2_ = uStack_1dd2;
  auVar56._14_2_ = uStack_1de2;
  auVar55._8_8_ = 0x8a914e808a914e8;
  auVar55._0_8_ = 0x8a914e808a914e8;
  auVar96 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_1ae0;
  auVar54._0_2_ = uStack_1ad0;
  auVar54._4_2_ = uStack_1ace;
  auVar54._6_2_ = uStack_1ade;
  auVar54._10_2_ = uStack_1adc;
  auVar54._8_2_ = uStack_1acc;
  auVar54._12_2_ = uStack_1aca;
  auVar54._14_2_ = uStack_1ada;
  auVar53._8_8_ = 0x8a914e808a914e8;
  auVar53._0_8_ = 0x8a914e808a914e8;
  auVar97 = pmaddwd(auVar54,auVar53);
  local_1618 = (short)uVar5;
  sStack_1616 = (short)((ulong)uVar5 >> 0x10);
  sStack_1614 = (short)((ulong)uVar5 >> 0x20);
  sStack_1612 = (short)((ulong)uVar5 >> 0x30);
  sStack_1610 = (short)uVar6;
  sStack_160e = (short)((ulong)uVar6 >> 0x10);
  sStack_160c = (short)((ulong)uVar6 >> 0x20);
  sStack_160a = (short)((ulong)uVar6 >> 0x30);
  local_1628 = (short)uVar13;
  sStack_1626 = (short)((ulong)uVar13 >> 0x10);
  sStack_1624 = (short)((ulong)uVar13 >> 0x20);
  sStack_1622 = (short)((ulong)uVar13 >> 0x30);
  sStack_1620 = (short)uVar14;
  sStack_161e = (short)((ulong)uVar14 >> 0x10);
  sStack_161c = (short)((ulong)uVar14 >> 0x20);
  sStack_161a = (short)((ulong)uVar14 >> 0x30);
  local_10d8 = (uint)(ushort)(local_1618 + local_1628) << 0x10;
  iStack_10d4 = (uint)(ushort)(sStack_1616 + sStack_1626) << 0x10;
  iStack_10d0 = (uint)(ushort)(sStack_1614 + sStack_1624) << 0x10;
  iStack_10cc = (uint)(ushort)(sStack_1612 + sStack_1622) << 0x10;
  auVar119 = ZEXT416(4);
  local_10f8 = (uint)(ushort)(sStack_1610 + sStack_1620) << 0x10;
  iStack_10f4 = (uint)(ushort)(sStack_160e + sStack_161e) << 0x10;
  iStack_10f0 = (uint)(ushort)(sStack_160c + sStack_161c) << 0x10;
  iStack_10ec = (uint)(ushort)(sStack_160a + sStack_161a) << 0x10;
  auVar120 = ZEXT416(4);
  local_1118 = (uint)(ushort)(local_1618 - local_1628) << 0x10;
  iStack_1114 = (uint)(ushort)(sStack_1616 - sStack_1626) << 0x10;
  iStack_1110 = (uint)(ushort)(sStack_1614 - sStack_1624) << 0x10;
  iStack_110c = (uint)(ushort)(sStack_1612 - sStack_1622) << 0x10;
  auVar121 = ZEXT416(4);
  local_1138 = (uint)(ushort)(sStack_1610 - sStack_1620) << 0x10;
  iStack_1134 = (uint)(ushort)(sStack_160e - sStack_161e) << 0x10;
  iStack_1130 = (uint)(ushort)(sStack_160c - sStack_161c) << 0x10;
  iStack_112c = (uint)(ushort)(sStack_160a - sStack_161a) << 0x10;
  auVar122 = ZEXT416(4);
  local_968 = auVar96._0_4_;
  iStack_964 = auVar96._4_4_;
  iStack_960 = auVar96._8_4_;
  iStack_95c = auVar96._12_4_;
  local_988 = auVar97._0_4_;
  iStack_984 = auVar97._4_4_;
  iStack_980 = auVar97._8_4_;
  iStack_97c = auVar97._12_4_;
  local_9a8 = auVar94._0_4_;
  iStack_9a4 = auVar94._4_4_;
  iStack_9a0 = auVar94._8_4_;
  iStack_99c = auVar94._12_4_;
  local_9c8 = auVar95._0_4_;
  iStack_9c4 = auVar95._4_4_;
  iStack_9c0 = auVar95._8_4_;
  iStack_9bc = auVar95._12_4_;
  local_1e38 = (short)uVar19;
  sStack_1e36 = (short)((ulong)uVar19 >> 0x10);
  sStack_1e34 = (short)((ulong)uVar19 >> 0x20);
  sStack_1e32 = (short)((ulong)uVar19 >> 0x30);
  local_1e48 = (short)uVar11;
  sStack_1e46 = (short)((ulong)uVar11 >> 0x10);
  sStack_1e44 = (short)((ulong)uVar11 >> 0x20);
  sStack_1e42 = (short)((ulong)uVar11 >> 0x30);
  sStack_1b30 = (short)uVar20;
  sStack_1b2e = (short)((ulong)uVar20 >> 0x10);
  sStack_1b2c = (short)((ulong)uVar20 >> 0x20);
  sStack_1b2a = (short)((ulong)uVar20 >> 0x30);
  sStack_1b40 = (short)uVar12;
  sStack_1b3e = (short)((ulong)uVar12 >> 0x10);
  sStack_1b3c = (short)((ulong)uVar12 >> 0x20);
  sStack_1b3a = (short)((ulong)uVar12 >> 0x30);
  auVar52._2_2_ = local_1e48;
  auVar52._0_2_ = local_1e38;
  auVar52._4_2_ = sStack_1e36;
  auVar52._6_2_ = sStack_1e46;
  auVar52._10_2_ = sStack_1e44;
  auVar52._8_2_ = sStack_1e34;
  auVar52._12_2_ = sStack_1e32;
  auVar52._14_2_ = sStack_1e42;
  auVar51._8_8_ = 0xe09ee565e09ee565;
  auVar51._0_8_ = 0xe09ee565e09ee565;
  auVar94 = pmaddwd(auVar52,auVar51);
  auVar50._2_2_ = sStack_1b40;
  auVar50._0_2_ = sStack_1b30;
  auVar50._4_2_ = sStack_1b2e;
  auVar50._6_2_ = sStack_1b3e;
  auVar50._10_2_ = sStack_1b3c;
  auVar50._8_2_ = sStack_1b2c;
  auVar50._12_2_ = sStack_1b2a;
  auVar50._14_2_ = sStack_1b3a;
  auVar49._8_8_ = 0xe09ee565e09ee565;
  auVar49._0_8_ = 0xe09ee565e09ee565;
  auVar95 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = local_1e48;
  auVar48._0_2_ = local_1e38;
  auVar48._4_2_ = sStack_1e36;
  auVar48._6_2_ = sStack_1e46;
  auVar48._10_2_ = sStack_1e44;
  auVar48._8_2_ = sStack_1e34;
  auVar48._12_2_ = sStack_1e32;
  auVar48._14_2_ = sStack_1e42;
  auVar47._8_8_ = 0x11c8e09e11c8e09e;
  auVar47._0_8_ = 0x11c8e09e11c8e09e;
  auVar96 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = sStack_1b40;
  auVar46._0_2_ = sStack_1b30;
  auVar46._4_2_ = sStack_1b2e;
  auVar46._6_2_ = sStack_1b3e;
  auVar46._10_2_ = sStack_1b3c;
  auVar46._8_2_ = sStack_1b2c;
  auVar46._12_2_ = sStack_1b2a;
  auVar46._14_2_ = sStack_1b3a;
  auVar45._8_8_ = 0x11c8e09e11c8e09e;
  auVar45._0_8_ = 0x11c8e09e11c8e09e;
  auVar97 = pmaddwd(auVar46,auVar45);
  local_1e58 = (short)uVar15;
  sStack_1e56 = (short)((ulong)uVar15 >> 0x10);
  sStack_1e54 = (short)((ulong)uVar15 >> 0x20);
  sStack_1e52 = (short)((ulong)uVar15 >> 0x30);
  local_1e68 = (short)uVar7;
  sStack_1e66 = (short)((ulong)uVar7 >> 0x10);
  sStack_1e64 = (short)((ulong)uVar7 >> 0x20);
  sStack_1e62 = (short)((ulong)uVar7 >> 0x30);
  sStack_1b50 = (short)uVar16;
  sStack_1b4e = (short)((ulong)uVar16 >> 0x10);
  sStack_1b4c = (short)((ulong)uVar16 >> 0x20);
  sStack_1b4a = (short)((ulong)uVar16 >> 0x30);
  sStack_1b60 = (short)uVar8;
  sStack_1b5e = (short)((ulong)uVar8 >> 0x10);
  sStack_1b5c = (short)((ulong)uVar8 >> 0x20);
  sStack_1b5a = (short)((ulong)uVar8 >> 0x30);
  auVar44._2_2_ = local_1e68;
  auVar44._0_2_ = local_1e58;
  auVar44._4_2_ = sStack_1e56;
  auVar44._6_2_ = sStack_1e66;
  auVar44._10_2_ = sStack_1e64;
  auVar44._8_2_ = sStack_1e54;
  auVar44._12_2_ = sStack_1e52;
  auVar44._14_2_ = sStack_1e62;
  auVar43._8_8_ = 0xf9c31a9df9c31a9d;
  auVar43._0_8_ = 0xf9c31a9df9c31a9d;
  auVar104 = pmaddwd(auVar44,auVar43);
  auVar42._2_2_ = sStack_1b60;
  auVar42._0_2_ = sStack_1b50;
  auVar42._4_2_ = sStack_1b4e;
  auVar42._6_2_ = sStack_1b5e;
  auVar42._10_2_ = sStack_1b5c;
  auVar42._8_2_ = sStack_1b4c;
  auVar42._12_2_ = sStack_1b4a;
  auVar42._14_2_ = sStack_1b5a;
  auVar41._8_8_ = 0xf9c31a9df9c31a9d;
  auVar41._0_8_ = 0xf9c31a9df9c31a9d;
  auVar105 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = local_1e68;
  auVar40._0_2_ = local_1e58;
  auVar40._4_2_ = sStack_1e56;
  auVar40._6_2_ = sStack_1e66;
  auVar40._10_2_ = sStack_1e64;
  auVar40._8_2_ = sStack_1e54;
  auVar40._12_2_ = sStack_1e52;
  auVar40._14_2_ = sStack_1e62;
  auVar39._8_8_ = 0x11c8f9c311c8f9c3;
  auVar39._0_8_ = 0x11c8f9c311c8f9c3;
  auVar106 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = sStack_1b60;
  auVar38._0_2_ = sStack_1b50;
  auVar38._4_2_ = sStack_1b4e;
  auVar38._6_2_ = sStack_1b5e;
  auVar38._10_2_ = sStack_1b5c;
  auVar38._8_2_ = sStack_1b4c;
  auVar38._12_2_ = sStack_1b4a;
  auVar38._14_2_ = sStack_1b5a;
  auVar37._8_8_ = 0x11c8f9c311c8f9c3;
  auVar37._0_8_ = 0x11c8f9c311c8f9c3;
  auVar107 = pmaddwd(auVar38,auVar37);
  auVar36._2_2_ = local_1e48 + local_1e58;
  auVar36._0_2_ = local_1e68 + local_1e38;
  auVar36._4_2_ = sStack_1e66 + sStack_1e36;
  auVar36._6_2_ = sStack_1e46 + sStack_1e56;
  auVar36._10_2_ = sStack_1e44 + sStack_1e54;
  auVar36._8_2_ = sStack_1e64 + sStack_1e34;
  auVar36._12_2_ = sStack_1e62 + sStack_1e32;
  auVar36._14_2_ = sStack_1e42 + sStack_1e52;
  auVar35._8_8_ = 0x12d0046b12d0046b;
  auVar35._0_8_ = 0x12d0046b12d0046b;
  auVar108 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = sStack_1b40 + sStack_1b50;
  auVar34._0_2_ = sStack_1b60 + sStack_1b30;
  auVar34._4_2_ = sStack_1b5e + sStack_1b2e;
  auVar34._6_2_ = sStack_1b3e + sStack_1b4e;
  auVar34._10_2_ = sStack_1b3c + sStack_1b4c;
  auVar34._8_2_ = sStack_1b5c + sStack_1b2c;
  auVar34._12_2_ = sStack_1b5a + sStack_1b2a;
  auVar34._14_2_ = sStack_1b3a + sStack_1b4a;
  auVar33._8_8_ = 0x12d0046b12d0046b;
  auVar33._0_8_ = 0x12d0046b12d0046b;
  auVar109 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = local_1e48 + local_1e58;
  auVar32._0_2_ = local_1e68 + local_1e38;
  auVar32._4_2_ = sStack_1e66 + sStack_1e36;
  auVar32._6_2_ = sStack_1e46 + sStack_1e56;
  auVar32._10_2_ = sStack_1e44 + sStack_1e54;
  auVar32._8_2_ = sStack_1e64 + sStack_1e34;
  auVar32._12_2_ = sStack_1e62 + sStack_1e32;
  auVar32._14_2_ = sStack_1e42 + sStack_1e52;
  auVar31._8_8_ = 0xe9cf12d0e9cf12d0;
  auVar31._0_8_ = 0xe9cf12d0e9cf12d0;
  auVar110 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = sStack_1b40 + sStack_1b50;
  auVar30._0_2_ = sStack_1b60 + sStack_1b30;
  auVar30._4_2_ = sStack_1b5e + sStack_1b2e;
  auVar30._6_2_ = sStack_1b3e + sStack_1b4e;
  auVar30._10_2_ = sStack_1b3c + sStack_1b4c;
  auVar30._8_2_ = sStack_1b5c + sStack_1b2c;
  auVar30._12_2_ = sStack_1b5a + sStack_1b2a;
  auVar30._14_2_ = sStack_1b3a + sStack_1b4a;
  auVar29._8_8_ = 0xe9cf12d0e9cf12d0;
  auVar29._0_8_ = 0xe9cf12d0e9cf12d0;
  auVar111 = pmaddwd(auVar30,auVar29);
  local_9d8 = auVar94._0_4_;
  iStack_9d4 = auVar94._4_4_;
  iStack_9d0 = auVar94._8_4_;
  iStack_9cc = auVar94._12_4_;
  local_9e8 = auVar108._0_4_;
  iStack_9e4 = auVar108._4_4_;
  iStack_9e0 = auVar108._8_4_;
  iStack_9dc = auVar108._12_4_;
  local_9f8 = auVar95._0_4_;
  iStack_9f4 = auVar95._4_4_;
  iStack_9f0 = auVar95._8_4_;
  iStack_9ec = auVar95._12_4_;
  local_a08 = auVar109._0_4_;
  iStack_a04 = auVar109._4_4_;
  iStack_a00 = auVar109._8_4_;
  iStack_9fc = auVar109._12_4_;
  local_a18 = auVar104._0_4_;
  iStack_a14 = auVar104._4_4_;
  iStack_a10 = auVar104._8_4_;
  iStack_a0c = auVar104._12_4_;
  local_a28 = auVar110._0_4_;
  iStack_a24 = auVar110._4_4_;
  iStack_a20 = auVar110._8_4_;
  iStack_a1c = auVar110._12_4_;
  local_a38 = auVar105._0_4_;
  iStack_a34 = auVar105._4_4_;
  iStack_a30 = auVar105._8_4_;
  iStack_a2c = auVar105._12_4_;
  local_a48 = auVar111._0_4_;
  iStack_a44 = auVar111._4_4_;
  iStack_a40 = auVar111._8_4_;
  iStack_a3c = auVar111._12_4_;
  local_a58 = auVar96._0_4_;
  iStack_a54 = auVar96._4_4_;
  iStack_a50 = auVar96._8_4_;
  iStack_a4c = auVar96._12_4_;
  local_a78 = auVar97._0_4_;
  iStack_a74 = auVar97._4_4_;
  iStack_a70 = auVar97._8_4_;
  iStack_a6c = auVar97._12_4_;
  local_a98 = auVar106._0_4_;
  iStack_a94 = auVar106._4_4_;
  iStack_a90 = auVar106._8_4_;
  iStack_a8c = auVar106._12_4_;
  local_ab8 = auVar107._0_4_;
  iStack_ab4 = auVar107._4_4_;
  iStack_ab0 = auVar107._8_4_;
  iStack_aac = auVar107._12_4_;
  iVar102 = (local_10d8 >> auVar119) + local_968 + 0x200;
  iVar113 = (iStack_10d4 >> auVar119) + iStack_964 + 0x200;
  iVar115 = (iStack_10d0 >> auVar119) + iStack_960 + 0x200;
  iVar117 = (iStack_10cc >> auVar119) + iStack_95c + 0x200;
  iVar103 = (local_10f8 >> auVar120) + local_988 + 0x200;
  iVar114 = (iStack_10f4 >> auVar120) + iStack_984 + 0x200;
  iVar116 = (iStack_10f0 >> auVar120) + iStack_980 + 0x200;
  iVar118 = (iStack_10ec >> auVar120) + iStack_97c + 0x200;
  auVar94 = ZEXT416(10);
  auVar95 = ZEXT416(10);
  auVar92._4_4_ = iVar113 + iStack_a94 + iStack_9e4 >> auVar94;
  auVar92._0_4_ = iVar102 + local_a98 + local_9e8 >> auVar94;
  auVar92._8_4_ = iVar115 + iStack_a90 + iStack_9e0 >> auVar94;
  auVar92._12_4_ = iVar117 + iStack_a8c + iStack_9dc >> auVar94;
  auVar91._4_4_ = iVar114 + iStack_ab4 + iStack_a04 >> auVar95;
  auVar91._0_4_ = iVar103 + local_ab8 + local_a08 >> auVar95;
  auVar91._8_4_ = iVar116 + iStack_ab0 + iStack_a00 >> auVar95;
  auVar91._12_4_ = iVar118 + iStack_aac + iStack_9fc >> auVar95;
  auVar94 = packssdw(auVar92,auVar91);
  auVar95 = ZEXT416(10);
  auVar96 = ZEXT416(10);
  auVar90._4_4_ = iVar113 - (iStack_a94 + iStack_9e4) >> auVar95;
  auVar90._0_4_ = iVar102 - (local_a98 + local_9e8) >> auVar95;
  auVar90._8_4_ = iVar115 - (iStack_a90 + iStack_9e0) >> auVar95;
  auVar90._12_4_ = iVar117 - (iStack_a8c + iStack_9dc) >> auVar95;
  auVar89._4_4_ = iVar114 - (iStack_ab4 + iStack_a04) >> auVar96;
  auVar89._0_4_ = iVar103 - (local_ab8 + local_a08) >> auVar96;
  auVar89._8_4_ = iVar116 - (iStack_ab0 + iStack_a00) >> auVar96;
  auVar89._12_4_ = iVar118 - (iStack_aac + iStack_9fc) >> auVar96;
  auVar95 = packssdw(auVar90,auVar89);
  iVar102 = (local_1118 >> auVar121) + local_9a8 + 0x200;
  iVar113 = (iStack_1114 >> auVar121) + iStack_9a4 + 0x200;
  iVar115 = (iStack_1110 >> auVar121) + iStack_9a0 + 0x200;
  iVar117 = (iStack_110c >> auVar121) + iStack_99c + 0x200;
  iVar103 = (local_1138 >> auVar122) + local_9c8 + 0x200;
  iVar114 = (iStack_1134 >> auVar122) + iStack_9c4 + 0x200;
  iVar116 = (iStack_1130 >> auVar122) + iStack_9c0 + 0x200;
  iVar118 = (iStack_112c >> auVar122) + iStack_9bc + 0x200;
  auVar96 = ZEXT416(10);
  auVar97 = ZEXT416(10);
  auVar88._4_4_ = iVar113 + iStack_a54 + iStack_a24 >> auVar96;
  auVar88._0_4_ = iVar102 + local_a58 + local_a28 >> auVar96;
  auVar88._8_4_ = iVar115 + iStack_a50 + iStack_a20 >> auVar96;
  auVar88._12_4_ = iVar117 + iStack_a4c + iStack_a1c >> auVar96;
  auVar87._4_4_ = iVar114 + iStack_a74 + iStack_a44 >> auVar97;
  auVar87._0_4_ = iVar103 + local_a78 + local_a48 >> auVar97;
  auVar87._8_4_ = iVar116 + iStack_a70 + iStack_a40 >> auVar97;
  auVar87._12_4_ = iVar118 + iStack_a6c + iStack_a3c >> auVar97;
  auVar96 = packssdw(auVar88,auVar87);
  auVar97 = ZEXT416(10);
  auVar104 = ZEXT416(10);
  auVar86._4_4_ = iVar113 - (iStack_a54 + iStack_a24) >> auVar97;
  auVar86._0_4_ = iVar102 - (local_a58 + local_a28) >> auVar97;
  auVar86._8_4_ = iVar115 - (iStack_a50 + iStack_a20) >> auVar97;
  auVar86._12_4_ = iVar117 - (iStack_a4c + iStack_a1c) >> auVar97;
  auVar85._4_4_ = iVar114 - (iStack_a74 + iStack_a44) >> auVar104;
  auVar85._0_4_ = iVar103 - (local_a78 + local_a48) >> auVar104;
  auVar85._8_4_ = iVar116 - (iStack_a70 + iStack_a40) >> auVar104;
  auVar85._12_4_ = iVar118 - (iStack_a6c + iStack_a3c) >> auVar104;
  auVar97 = packssdw(auVar86,auVar85);
  iVar102 = ((local_1118 >> auVar121) - local_9a8) + 0x200;
  iVar113 = ((iStack_1114 >> auVar121) - iStack_9a4) + 0x200;
  iVar115 = ((iStack_1110 >> auVar121) - iStack_9a0) + 0x200;
  iVar117 = ((iStack_110c >> auVar121) - iStack_99c) + 0x200;
  iVar103 = ((local_1138 >> auVar122) - local_9c8) + 0x200;
  iVar114 = ((iStack_1134 >> auVar122) - iStack_9c4) + 0x200;
  iVar116 = ((iStack_1130 >> auVar122) - iStack_9c0) + 0x200;
  iVar118 = ((iStack_112c >> auVar122) - iStack_9bc) + 0x200;
  auVar104 = ZEXT416(10);
  auVar105 = ZEXT416(10);
  auVar84._4_4_ = iVar113 + iStack_a14 + iStack_a24 >> auVar104;
  auVar84._0_4_ = iVar102 + local_a18 + local_a28 >> auVar104;
  auVar84._8_4_ = iVar115 + iStack_a10 + iStack_a20 >> auVar104;
  auVar84._12_4_ = iVar117 + iStack_a0c + iStack_a1c >> auVar104;
  auVar83._4_4_ = iVar114 + iStack_a34 + iStack_a44 >> auVar105;
  auVar83._0_4_ = iVar103 + local_a38 + local_a48 >> auVar105;
  auVar83._8_4_ = iVar116 + iStack_a30 + iStack_a40 >> auVar105;
  auVar83._12_4_ = iVar118 + iStack_a2c + iStack_a3c >> auVar105;
  auVar104 = packssdw(auVar84,auVar83);
  auVar105 = ZEXT416(10);
  auVar106 = ZEXT416(10);
  auVar82._4_4_ = iVar113 - (iStack_a14 + iStack_a24) >> auVar105;
  auVar82._0_4_ = iVar102 - (local_a18 + local_a28) >> auVar105;
  auVar82._8_4_ = iVar115 - (iStack_a10 + iStack_a20) >> auVar105;
  auVar82._12_4_ = iVar117 - (iStack_a0c + iStack_a1c) >> auVar105;
  auVar81._4_4_ = iVar114 - (iStack_a34 + iStack_a44) >> auVar106;
  auVar81._0_4_ = iVar103 - (local_a38 + local_a48) >> auVar106;
  auVar81._8_4_ = iVar116 - (iStack_a30 + iStack_a40) >> auVar106;
  auVar81._12_4_ = iVar118 - (iStack_a2c + iStack_a3c) >> auVar106;
  auVar105 = packssdw(auVar82,auVar81);
  iVar102 = ((local_10d8 >> auVar119) - local_968) + 0x200;
  iVar113 = ((iStack_10d4 >> auVar119) - iStack_964) + 0x200;
  iVar115 = ((iStack_10d0 >> auVar119) - iStack_960) + 0x200;
  iVar117 = ((iStack_10cc >> auVar119) - iStack_95c) + 0x200;
  iVar103 = ((local_10f8 >> auVar120) - local_988) + 0x200;
  iVar114 = ((iStack_10f4 >> auVar120) - iStack_984) + 0x200;
  iVar116 = ((iStack_10f0 >> auVar120) - iStack_980) + 0x200;
  iVar118 = ((iStack_10ec >> auVar120) - iStack_97c) + 0x200;
  auVar106 = ZEXT416(10);
  auVar107 = ZEXT416(10);
  auVar80._4_4_ = iVar113 + iStack_9d4 + iStack_9e4 >> auVar106;
  auVar80._0_4_ = iVar102 + local_9d8 + local_9e8 >> auVar106;
  auVar80._8_4_ = iVar115 + iStack_9d0 + iStack_9e0 >> auVar106;
  auVar80._12_4_ = iVar117 + iStack_9cc + iStack_9dc >> auVar106;
  auVar79._4_4_ = iVar114 + iStack_9f4 + iStack_a04 >> auVar107;
  auVar79._0_4_ = iVar103 + local_9f8 + local_a08 >> auVar107;
  auVar79._8_4_ = iVar116 + iStack_9f0 + iStack_a00 >> auVar107;
  auVar79._12_4_ = iVar118 + iStack_9ec + iStack_9fc >> auVar107;
  auVar106 = packssdw(auVar80,auVar79);
  auVar107 = ZEXT416(10);
  auVar108 = ZEXT416(10);
  auVar78._4_4_ = iVar113 - (iStack_9d4 + iStack_9e4) >> auVar107;
  auVar78._0_4_ = iVar102 - (local_9d8 + local_9e8) >> auVar107;
  auVar78._8_4_ = iVar115 - (iStack_9d0 + iStack_9e0) >> auVar107;
  auVar78._12_4_ = iVar117 - (iStack_9cc + iStack_9dc) >> auVar107;
  auVar77._4_4_ = iVar114 - (iStack_9f4 + iStack_a04) >> auVar108;
  auVar77._0_4_ = iVar103 - (local_9f8 + local_a08) >> auVar108;
  auVar77._8_4_ = iVar116 - (iStack_9f0 + iStack_a00) >> auVar108;
  auVar77._12_4_ = iVar118 - (iStack_9ec + iStack_9fc) >> auVar108;
  auVar107 = packssdw(auVar78,auVar77);
  local_1e98 = auVar94._0_2_;
  sStack_1e96 = auVar94._2_2_;
  uStack_1e94 = auVar94._4_2_;
  sStack_1e92 = auVar94._6_2_;
  local_1ea8 = auVar107._0_2_;
  sStack_1ea6 = auVar107._2_2_;
  uStack_1ea4 = auVar107._4_2_;
  sStack_1ea2 = auVar107._6_2_;
  row0[0]._6_2_ = auVar94._14_2_;
  sStack_1b90 = auVar94._8_2_;
  sStack_1b8e = auVar94._10_2_;
  uStack_1b8c = auVar94._12_2_;
  sStack_1ba0 = auVar107._8_2_;
  sStack_1b9e = auVar107._10_2_;
  uStack_1b9c = auVar107._12_2_;
  sStack_1b9a = auVar107._14_2_;
  local_1eb8 = auVar96._0_2_;
  sStack_1eb6 = auVar96._2_2_;
  uStack_1eb4 = auVar96._4_2_;
  sStack_1eb2 = auVar96._6_2_;
  local_1ec8 = auVar105._0_2_;
  sStack_1ec6 = auVar105._2_2_;
  uStack_1ec4 = auVar105._4_2_;
  sStack_1ec2 = auVar105._6_2_;
  row1[0]._6_2_ = auVar96._14_2_;
  sStack_1bb0 = auVar96._8_2_;
  sStack_1bae = auVar96._10_2_;
  uStack_1bac = auVar96._12_2_;
  sStack_1bc0 = auVar105._8_2_;
  sStack_1bbe = auVar105._10_2_;
  uStack_1bbc = auVar105._12_2_;
  sStack_1bba = auVar105._14_2_;
  local_1ed8 = auVar104._0_2_;
  sStack_1ed6 = auVar104._2_2_;
  uStack_1ed4 = auVar104._4_2_;
  sStack_1ed2 = auVar104._6_2_;
  local_1ee8 = auVar97._0_2_;
  sStack_1ee6 = auVar97._2_2_;
  uStack_1ee4 = auVar97._4_2_;
  sStack_1ee2 = auVar97._6_2_;
  row2[0]._6_2_ = auVar104._14_2_;
  sStack_1bd0 = auVar104._8_2_;
  sStack_1bce = auVar104._10_2_;
  uStack_1bcc = auVar104._12_2_;
  sStack_1be0 = auVar97._8_2_;
  sStack_1bde = auVar97._10_2_;
  uStack_1bdc = auVar97._12_2_;
  sStack_1bda = auVar97._14_2_;
  local_1ef8 = auVar106._0_2_;
  sStack_1ef6 = auVar106._2_2_;
  uStack_1ef4 = auVar106._4_2_;
  sStack_1ef2 = auVar106._6_2_;
  local_1f08 = auVar95._0_2_;
  sStack_1f06 = auVar95._2_2_;
  uStack_1f04 = auVar95._4_2_;
  sStack_1f02 = auVar95._6_2_;
  row3[0]._6_2_ = auVar106._14_2_;
  sStack_1bf0 = auVar106._8_2_;
  sStack_1bee = auVar106._10_2_;
  uStack_1bec = auVar106._12_2_;
  sStack_1c00 = auVar95._8_2_;
  sStack_1bfe = auVar95._10_2_;
  uStack_1bfc = auVar95._12_2_;
  sStack_1bfa = auVar95._14_2_;
  auVar28._2_2_ = uStack_1b8c;
  auVar28._0_2_ = uStack_1e94;
  auVar28._4_2_ = uStack_1eb4;
  auVar28._6_2_ = uStack_1bac;
  auVar28._10_2_ = uStack_1bcc;
  auVar28._8_2_ = uStack_1ed4;
  auVar28._12_2_ = uStack_1ef4;
  auVar28._14_2_ = uStack_1bec;
  auVar27._8_8_ = 0xeb1a08a9eb1a08a9;
  auVar27._0_8_ = 0xeb1a08a9eb1a08a9;
  auVar94 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_1b9c;
  auVar26._0_2_ = uStack_1ea4;
  auVar26._4_2_ = uStack_1ec4;
  auVar26._6_2_ = uStack_1bbc;
  auVar26._10_2_ = uStack_1bdc;
  auVar26._8_2_ = uStack_1ee4;
  auVar26._12_2_ = uStack_1f04;
  auVar26._14_2_ = uStack_1bfc;
  auVar25._8_8_ = 0xeb1a08a9eb1a08a9;
  auVar25._0_8_ = 0xeb1a08a9eb1a08a9;
  auVar95 = pmaddwd(auVar26,auVar25);
  auVar125._2_2_ = uStack_1b8c;
  auVar125._0_2_ = uStack_1e94;
  auVar125._4_2_ = uStack_1eb4;
  auVar125._6_2_ = uStack_1bac;
  auVar125._10_2_ = uStack_1bcc;
  auVar125._8_2_ = uStack_1ed4;
  auVar125._12_2_ = uStack_1ef4;
  auVar125._14_2_ = uStack_1bec;
  auVar124._8_8_ = 0x8a914e808a914e8;
  auVar124._0_8_ = 0x8a914e808a914e8;
  auVar96 = pmaddwd(auVar125,auVar124);
  auVar123._2_2_ = uStack_1b9c;
  auVar123._0_2_ = uStack_1ea4;
  auVar123._4_2_ = uStack_1ec4;
  auVar123._6_2_ = uStack_1bbc;
  auVar123._10_2_ = uStack_1bdc;
  auVar123._8_2_ = uStack_1ee4;
  auVar123._12_2_ = uStack_1f04;
  auVar123._14_2_ = uStack_1bfc;
  auVar112._8_8_ = 0x8a914e808a914e8;
  auVar112._0_8_ = 0x8a914e808a914e8;
  auVar97 = pmaddwd(auVar123,auVar112);
  local_1358 = (uint)(ushort)(local_1e98 + sStack_1b90) << 0x10;
  iStack_1354 = (uint)(ushort)(local_1eb8 + sStack_1bb0) << 0x10;
  iStack_1350 = (uint)(ushort)(local_1ed8 + sStack_1bd0) << 0x10;
  iStack_134c = (uint)(ushort)(local_1ef8 + sStack_1bf0) << 0x10;
  auVar123 = ZEXT416(4);
  local_1378 = (uint)(ushort)(local_1ea8 + sStack_1ba0) << 0x10;
  iStack_1374 = (uint)(ushort)(local_1ec8 + sStack_1bc0) << 0x10;
  iStack_1370 = (uint)(ushort)(local_1ee8 + sStack_1be0) << 0x10;
  iStack_136c = (uint)(ushort)(local_1f08 + sStack_1c00) << 0x10;
  auVar124 = ZEXT416(4);
  local_1398 = (uint)(ushort)(local_1e98 - sStack_1b90) << 0x10;
  iStack_1394 = (uint)(ushort)(local_1eb8 - sStack_1bb0) << 0x10;
  iStack_1390 = (uint)(ushort)(local_1ed8 - sStack_1bd0) << 0x10;
  iStack_138c = (uint)(ushort)(local_1ef8 - sStack_1bf0) << 0x10;
  auVar125 = ZEXT416(4);
  local_13b8 = (uint)(ushort)(local_1ea8 - sStack_1ba0) << 0x10;
  iStack_13b4 = (uint)(ushort)(local_1ec8 - sStack_1bc0) << 0x10;
  iStack_13b0 = (uint)(ushort)(local_1ee8 - sStack_1be0) << 0x10;
  iStack_13ac = (uint)(ushort)(local_1f08 - sStack_1c00) << 0x10;
  auVar112 = ZEXT416(4);
  local_ce8 = auVar96._0_4_;
  iStack_ce4 = auVar96._4_4_;
  iStack_ce0 = auVar96._8_4_;
  iStack_cdc = auVar96._12_4_;
  local_d08 = auVar97._0_4_;
  iStack_d04 = auVar97._4_4_;
  iStack_d00 = auVar97._8_4_;
  iStack_cfc = auVar97._12_4_;
  local_d28 = auVar94._0_4_;
  iStack_d24 = auVar94._4_4_;
  iStack_d20 = auVar94._8_4_;
  iStack_d1c = auVar94._12_4_;
  local_d48 = auVar95._0_4_;
  iStack_d44 = auVar95._4_4_;
  iStack_d40 = auVar95._8_4_;
  iStack_d3c = auVar95._12_4_;
  auVar24._2_2_ = sStack_1e92;
  auVar24._0_2_ = row0[0]._6_2_;
  auVar24._4_2_ = row1[0]._6_2_;
  auVar24._6_2_ = sStack_1eb2;
  auVar24._10_2_ = sStack_1ed2;
  auVar24._8_2_ = row2[0]._6_2_;
  auVar24._12_2_ = row3[0]._6_2_;
  auVar24._14_2_ = sStack_1ef2;
  auVar98._8_8_ = 0xe09ee565e09ee565;
  auVar98._0_8_ = 0xe09ee565e09ee565;
  auVar98 = pmaddwd(auVar24,auVar98);
  auVar23._2_2_ = sStack_1ea2;
  auVar23._0_2_ = sStack_1b9a;
  auVar23._4_2_ = sStack_1bba;
  auVar23._6_2_ = sStack_1ec2;
  auVar23._10_2_ = sStack_1ee2;
  auVar23._8_2_ = sStack_1bda;
  auVar23._12_2_ = sStack_1bfa;
  auVar23._14_2_ = sStack_1f02;
  auVar99._8_8_ = 0xe09ee565e09ee565;
  auVar99._0_8_ = 0xe09ee565e09ee565;
  auVar99 = pmaddwd(auVar23,auVar99);
  auVar22._2_2_ = sStack_1e92;
  auVar22._0_2_ = row0[0]._6_2_;
  auVar22._4_2_ = row1[0]._6_2_;
  auVar22._6_2_ = sStack_1eb2;
  auVar22._10_2_ = sStack_1ed2;
  auVar22._8_2_ = row2[0]._6_2_;
  auVar22._12_2_ = row3[0]._6_2_;
  auVar22._14_2_ = sStack_1ef2;
  auVar100._8_8_ = 0x11c8e09e11c8e09e;
  auVar100._0_8_ = 0x11c8e09e11c8e09e;
  auVar100 = pmaddwd(auVar22,auVar100);
  auVar21._2_2_ = sStack_1ea2;
  auVar21._0_2_ = sStack_1b9a;
  auVar21._4_2_ = sStack_1bba;
  auVar21._6_2_ = sStack_1ec2;
  auVar21._10_2_ = sStack_1ee2;
  auVar21._8_2_ = sStack_1bda;
  auVar21._12_2_ = sStack_1bfa;
  auVar21._14_2_ = sStack_1f02;
  auVar101._8_8_ = 0x11c8e09e11c8e09e;
  auVar101._0_8_ = 0x11c8e09e11c8e09e;
  auVar101 = pmaddwd(auVar21,auVar101);
  auVar122._2_2_ = sStack_1e96;
  auVar122._0_2_ = sStack_1b8e;
  auVar122._4_2_ = sStack_1bae;
  auVar122._6_2_ = sStack_1eb6;
  auVar122._10_2_ = sStack_1ed6;
  auVar122._8_2_ = sStack_1bce;
  auVar122._12_2_ = sStack_1bee;
  auVar122._14_2_ = sStack_1ef6;
  auVar121._8_8_ = 0xf9c31a9df9c31a9d;
  auVar121._0_8_ = 0xf9c31a9df9c31a9d;
  auVar121 = pmaddwd(auVar122,auVar121);
  auVar120._2_2_ = sStack_1ea6;
  auVar120._0_2_ = sStack_1b9e;
  auVar120._4_2_ = sStack_1bbe;
  auVar120._6_2_ = sStack_1ec6;
  auVar120._10_2_ = sStack_1ee6;
  auVar120._8_2_ = sStack_1bde;
  auVar120._12_2_ = sStack_1bfe;
  auVar120._14_2_ = sStack_1f06;
  auVar119._8_8_ = 0xf9c31a9df9c31a9d;
  auVar119._0_8_ = 0xf9c31a9df9c31a9d;
  auVar119 = pmaddwd(auVar120,auVar119);
  auVar111._2_2_ = sStack_1e96;
  auVar111._0_2_ = sStack_1b8e;
  auVar111._4_2_ = sStack_1bae;
  auVar111._6_2_ = sStack_1eb6;
  auVar111._10_2_ = sStack_1ed6;
  auVar111._8_2_ = sStack_1bce;
  auVar111._12_2_ = sStack_1bee;
  auVar111._14_2_ = sStack_1ef6;
  auVar110._8_8_ = 0x11c8f9c311c8f9c3;
  auVar110._0_8_ = 0x11c8f9c311c8f9c3;
  auVar110 = pmaddwd(auVar111,auVar110);
  auVar109._2_2_ = sStack_1ea6;
  auVar109._0_2_ = sStack_1b9e;
  auVar109._4_2_ = sStack_1bbe;
  auVar109._6_2_ = sStack_1ec6;
  auVar109._10_2_ = sStack_1ee6;
  auVar109._8_2_ = sStack_1bde;
  auVar109._12_2_ = sStack_1bfe;
  auVar109._14_2_ = sStack_1f06;
  auVar108._8_8_ = 0x11c8f9c311c8f9c3;
  auVar108._0_8_ = 0x11c8f9c311c8f9c3;
  auVar108 = pmaddwd(auVar109,auVar108);
  auVar107._2_2_ = sStack_1e92 + sStack_1b8e;
  auVar107._0_2_ = sStack_1e96 + row0[0]._6_2_;
  auVar107._4_2_ = sStack_1eb6 + row1[0]._6_2_;
  auVar107._6_2_ = sStack_1eb2 + sStack_1bae;
  auVar107._10_2_ = sStack_1ed2 + sStack_1bce;
  auVar107._8_2_ = sStack_1ed6 + row2[0]._6_2_;
  auVar107._12_2_ = sStack_1ef6 + row3[0]._6_2_;
  auVar107._14_2_ = sStack_1ef2 + sStack_1bee;
  auVar106._8_8_ = 0x12d0046b12d0046b;
  auVar106._0_8_ = 0x12d0046b12d0046b;
  auVar106 = pmaddwd(auVar107,auVar106);
  auVar105._2_2_ = sStack_1ea2 + sStack_1b9e;
  auVar105._0_2_ = sStack_1ea6 + sStack_1b9a;
  auVar105._4_2_ = sStack_1ec6 + sStack_1bba;
  auVar105._6_2_ = sStack_1ec2 + sStack_1bbe;
  auVar105._10_2_ = sStack_1ee2 + sStack_1bde;
  auVar105._8_2_ = sStack_1ee6 + sStack_1bda;
  auVar105._12_2_ = sStack_1f06 + sStack_1bfa;
  auVar105._14_2_ = sStack_1f02 + sStack_1bfe;
  auVar104._8_8_ = 0x12d0046b12d0046b;
  auVar104._0_8_ = 0x12d0046b12d0046b;
  auVar104 = pmaddwd(auVar105,auVar104);
  auVar97._2_2_ = sStack_1e92 + sStack_1b8e;
  auVar97._0_2_ = sStack_1e96 + row0[0]._6_2_;
  auVar97._4_2_ = sStack_1eb6 + row1[0]._6_2_;
  auVar97._6_2_ = sStack_1eb2 + sStack_1bae;
  auVar97._10_2_ = sStack_1ed2 + sStack_1bce;
  auVar97._8_2_ = sStack_1ed6 + row2[0]._6_2_;
  auVar97._12_2_ = sStack_1ef6 + row3[0]._6_2_;
  auVar97._14_2_ = sStack_1ef2 + sStack_1bee;
  auVar96._8_8_ = 0xe9cf12d0e9cf12d0;
  auVar96._0_8_ = 0xe9cf12d0e9cf12d0;
  auVar96 = pmaddwd(auVar97,auVar96);
  auVar95._2_2_ = sStack_1ea2 + sStack_1b9e;
  auVar95._0_2_ = sStack_1ea6 + sStack_1b9a;
  auVar95._4_2_ = sStack_1ec6 + sStack_1bba;
  auVar95._6_2_ = sStack_1ec2 + sStack_1bbe;
  auVar95._10_2_ = sStack_1ee2 + sStack_1bde;
  auVar95._8_2_ = sStack_1ee6 + sStack_1bda;
  auVar95._12_2_ = sStack_1f06 + sStack_1bfa;
  auVar95._14_2_ = sStack_1f02 + sStack_1bfe;
  auVar94._8_8_ = 0xe9cf12d0e9cf12d0;
  auVar94._0_8_ = 0xe9cf12d0e9cf12d0;
  auVar94 = pmaddwd(auVar95,auVar94);
  local_d58 = auVar98._0_4_;
  iStack_d54 = auVar98._4_4_;
  iStack_d50 = auVar98._8_4_;
  iStack_d4c = auVar98._12_4_;
  local_d68 = auVar106._0_4_;
  iStack_d64 = auVar106._4_4_;
  iStack_d60 = auVar106._8_4_;
  iStack_d5c = auVar106._12_4_;
  local_d78 = auVar99._0_4_;
  iStack_d74 = auVar99._4_4_;
  iStack_d70 = auVar99._8_4_;
  iStack_d6c = auVar99._12_4_;
  local_d88 = auVar104._0_4_;
  iStack_d84 = auVar104._4_4_;
  iStack_d80 = auVar104._8_4_;
  iStack_d7c = auVar104._12_4_;
  local_d98 = auVar121._0_4_;
  iStack_d94 = auVar121._4_4_;
  iStack_d90 = auVar121._8_4_;
  iStack_d8c = auVar121._12_4_;
  local_da8 = auVar96._0_4_;
  iStack_da4 = auVar96._4_4_;
  iStack_da0 = auVar96._8_4_;
  iStack_d9c = auVar96._12_4_;
  local_db8 = auVar119._0_4_;
  iStack_db4 = auVar119._4_4_;
  iStack_db0 = auVar119._8_4_;
  iStack_dac = auVar119._12_4_;
  local_dc8 = auVar94._0_4_;
  iStack_dc4 = auVar94._4_4_;
  iStack_dc0 = auVar94._8_4_;
  iStack_dbc = auVar94._12_4_;
  local_dd8 = auVar100._0_4_;
  iStack_dd4 = auVar100._4_4_;
  iStack_dd0 = auVar100._8_4_;
  iStack_dcc = auVar100._12_4_;
  local_df8 = auVar101._0_4_;
  iStack_df4 = auVar101._4_4_;
  iStack_df0 = auVar101._8_4_;
  iStack_dec = auVar101._12_4_;
  local_e18 = auVar110._0_4_;
  iStack_e14 = auVar110._4_4_;
  iStack_e10 = auVar110._8_4_;
  iStack_e0c = auVar110._12_4_;
  local_e38 = auVar108._0_4_;
  iStack_e34 = auVar108._4_4_;
  iStack_e30 = auVar108._8_4_;
  iStack_e2c = auVar108._12_4_;
  iVar102 = (local_1358 >> auVar123) + local_ce8 + 0x1010000;
  iVar113 = (iStack_1354 >> auVar123) + iStack_ce4 + 0x1010000;
  iVar115 = (iStack_1350 >> auVar123) + iStack_ce0 + 0x1010000;
  iVar117 = (iStack_134c >> auVar123) + iStack_cdc + 0x1010000;
  iVar103 = (local_1378 >> auVar124) + local_d08 + 0x1010000;
  iVar114 = (iStack_1374 >> auVar124) + iStack_d04 + 0x1010000;
  iVar116 = (iStack_1370 >> auVar124) + iStack_d00 + 0x1010000;
  iVar118 = (iStack_136c >> auVar124) + iStack_cfc + 0x1010000;
  auVar94 = ZEXT416(0x11);
  auVar95 = ZEXT416(0x11);
  auVar76._4_4_ = iVar113 + iStack_e14 + iStack_d64 >> auVar94;
  auVar76._0_4_ = iVar102 + local_e18 + local_d68 >> auVar94;
  auVar76._8_4_ = iVar115 + iStack_e10 + iStack_d60 >> auVar94;
  auVar76._12_4_ = iVar117 + iStack_e0c + iStack_d5c >> auVar94;
  auVar75._4_4_ = iVar114 + iStack_e34 + iStack_d84 >> auVar95;
  auVar75._0_4_ = iVar103 + local_e38 + local_d88 >> auVar95;
  auVar75._8_4_ = iVar116 + iStack_e30 + iStack_d80 >> auVar95;
  auVar75._12_4_ = iVar118 + iStack_e2c + iStack_d7c >> auVar95;
  auVar94 = packssdw(auVar76,auVar75);
  auVar95 = ZEXT416(0x11);
  auVar96 = ZEXT416(0x11);
  auVar74._4_4_ = iVar113 - (iStack_e14 + iStack_d64) >> auVar95;
  auVar74._0_4_ = iVar102 - (local_e18 + local_d68) >> auVar95;
  auVar74._8_4_ = iVar115 - (iStack_e10 + iStack_d60) >> auVar95;
  auVar74._12_4_ = iVar117 - (iStack_e0c + iStack_d5c) >> auVar95;
  auVar73._4_4_ = iVar114 - (iStack_e34 + iStack_d84) >> auVar96;
  auVar73._0_4_ = iVar103 - (local_e38 + local_d88) >> auVar96;
  auVar73._8_4_ = iVar116 - (iStack_e30 + iStack_d80) >> auVar96;
  auVar73._12_4_ = iVar118 - (iStack_e2c + iStack_d7c) >> auVar96;
  auVar95 = packssdw(auVar74,auVar73);
  iVar102 = (local_1398 >> auVar125) + local_d28 + 0x1010000;
  iVar113 = (iStack_1394 >> auVar125) + iStack_d24 + 0x1010000;
  iVar115 = (iStack_1390 >> auVar125) + iStack_d20 + 0x1010000;
  iVar117 = (iStack_138c >> auVar125) + iStack_d1c + 0x1010000;
  iVar103 = (local_13b8 >> auVar112) + local_d48 + 0x1010000;
  iVar114 = (iStack_13b4 >> auVar112) + iStack_d44 + 0x1010000;
  iVar116 = (iStack_13b0 >> auVar112) + iStack_d40 + 0x1010000;
  iVar118 = (iStack_13ac >> auVar112) + iStack_d3c + 0x1010000;
  auVar96 = ZEXT416(0x11);
  auVar97 = ZEXT416(0x11);
  auVar72._4_4_ = iVar113 + iStack_dd4 + iStack_da4 >> auVar96;
  auVar72._0_4_ = iVar102 + local_dd8 + local_da8 >> auVar96;
  auVar72._8_4_ = iVar115 + iStack_dd0 + iStack_da0 >> auVar96;
  auVar72._12_4_ = iVar117 + iStack_dcc + iStack_d9c >> auVar96;
  auVar71._4_4_ = iVar114 + iStack_df4 + iStack_dc4 >> auVar97;
  auVar71._0_4_ = iVar103 + local_df8 + local_dc8 >> auVar97;
  auVar71._8_4_ = iVar116 + iStack_df0 + iStack_dc0 >> auVar97;
  auVar71._12_4_ = iVar118 + iStack_dec + iStack_dbc >> auVar97;
  auVar96 = packssdw(auVar72,auVar71);
  auVar97 = ZEXT416(0x11);
  auVar104 = ZEXT416(0x11);
  auVar70._4_4_ = iVar113 - (iStack_dd4 + iStack_da4) >> auVar97;
  auVar70._0_4_ = iVar102 - (local_dd8 + local_da8) >> auVar97;
  auVar70._8_4_ = iVar115 - (iStack_dd0 + iStack_da0) >> auVar97;
  auVar70._12_4_ = iVar117 - (iStack_dcc + iStack_d9c) >> auVar97;
  auVar69._4_4_ = iVar114 - (iStack_df4 + iStack_dc4) >> auVar104;
  auVar69._0_4_ = iVar103 - (local_df8 + local_dc8) >> auVar104;
  auVar69._8_4_ = iVar116 - (iStack_df0 + iStack_dc0) >> auVar104;
  auVar69._12_4_ = iVar118 - (iStack_dec + iStack_dbc) >> auVar104;
  auVar97 = packssdw(auVar70,auVar69);
  iVar102 = ((local_1398 >> auVar125) - local_d28) + 0x1010000;
  iVar113 = ((iStack_1394 >> auVar125) - iStack_d24) + 0x1010000;
  iVar115 = ((iStack_1390 >> auVar125) - iStack_d20) + 0x1010000;
  iVar117 = ((iStack_138c >> auVar125) - iStack_d1c) + 0x1010000;
  iVar103 = ((local_13b8 >> auVar112) - local_d48) + 0x1010000;
  iVar114 = ((iStack_13b4 >> auVar112) - iStack_d44) + 0x1010000;
  iVar116 = ((iStack_13b0 >> auVar112) - iStack_d40) + 0x1010000;
  iVar118 = ((iStack_13ac >> auVar112) - iStack_d3c) + 0x1010000;
  auVar104 = ZEXT416(0x11);
  auVar105 = ZEXT416(0x11);
  auVar68._4_4_ = iVar113 + iStack_d94 + iStack_da4 >> auVar104;
  auVar68._0_4_ = iVar102 + local_d98 + local_da8 >> auVar104;
  auVar68._8_4_ = iVar115 + iStack_d90 + iStack_da0 >> auVar104;
  auVar68._12_4_ = iVar117 + iStack_d8c + iStack_d9c >> auVar104;
  auVar67._4_4_ = iVar114 + iStack_db4 + iStack_dc4 >> auVar105;
  auVar67._0_4_ = iVar103 + local_db8 + local_dc8 >> auVar105;
  auVar67._8_4_ = iVar116 + iStack_db0 + iStack_dc0 >> auVar105;
  auVar67._12_4_ = iVar118 + iStack_dac + iStack_dbc >> auVar105;
  auVar104 = packssdw(auVar68,auVar67);
  auVar105 = ZEXT416(0x11);
  auVar106 = ZEXT416(0x11);
  auVar66._4_4_ = iVar113 - (iStack_d94 + iStack_da4) >> auVar105;
  auVar66._0_4_ = iVar102 - (local_d98 + local_da8) >> auVar105;
  auVar66._8_4_ = iVar115 - (iStack_d90 + iStack_da0) >> auVar105;
  auVar66._12_4_ = iVar117 - (iStack_d8c + iStack_d9c) >> auVar105;
  auVar65._4_4_ = iVar114 - (iStack_db4 + iStack_dc4) >> auVar106;
  auVar65._0_4_ = iVar103 - (local_db8 + local_dc8) >> auVar106;
  auVar65._8_4_ = iVar116 - (iStack_db0 + iStack_dc0) >> auVar106;
  auVar65._12_4_ = iVar118 - (iStack_dac + iStack_dbc) >> auVar106;
  auVar105 = packssdw(auVar66,auVar65);
  iVar102 = ((local_1358 >> auVar123) - local_ce8) + 0x1010000;
  iVar113 = ((iStack_1354 >> auVar123) - iStack_ce4) + 0x1010000;
  iVar115 = ((iStack_1350 >> auVar123) - iStack_ce0) + 0x1010000;
  iVar117 = ((iStack_134c >> auVar123) - iStack_cdc) + 0x1010000;
  iVar103 = ((local_1378 >> auVar124) - local_d08) + 0x1010000;
  iVar114 = ((iStack_1374 >> auVar124) - iStack_d04) + 0x1010000;
  iVar116 = ((iStack_1370 >> auVar124) - iStack_d00) + 0x1010000;
  iVar118 = ((iStack_136c >> auVar124) - iStack_cfc) + 0x1010000;
  auVar106 = ZEXT416(0x11);
  auVar107 = ZEXT416(0x11);
  auVar64._4_4_ = iVar113 + iStack_d54 + iStack_d64 >> auVar106;
  auVar64._0_4_ = iVar102 + local_d58 + local_d68 >> auVar106;
  auVar64._8_4_ = iVar115 + iStack_d50 + iStack_d60 >> auVar106;
  auVar64._12_4_ = iVar117 + iStack_d4c + iStack_d5c >> auVar106;
  auVar63._4_4_ = iVar114 + iStack_d74 + iStack_d84 >> auVar107;
  auVar63._0_4_ = iVar103 + local_d78 + local_d88 >> auVar107;
  auVar63._8_4_ = iVar116 + iStack_d70 + iStack_d80 >> auVar107;
  auVar63._12_4_ = iVar118 + iStack_d6c + iStack_d7c >> auVar107;
  auVar106 = packssdw(auVar64,auVar63);
  auVar107 = ZEXT416(0x11);
  auVar108 = ZEXT416(0x11);
  auVar62._4_4_ = iVar113 - (iStack_d54 + iStack_d64) >> auVar107;
  auVar62._0_4_ = iVar102 - (local_d58 + local_d68) >> auVar107;
  auVar62._8_4_ = iVar115 - (iStack_d50 + iStack_d60) >> auVar107;
  auVar62._12_4_ = iVar117 - (iStack_d4c + iStack_d5c) >> auVar107;
  auVar61._4_4_ = iVar114 - (iStack_d74 + iStack_d84) >> auVar108;
  auVar61._0_4_ = iVar103 - (local_d78 + local_d88) >> auVar108;
  auVar61._8_4_ = iVar116 - (iStack_d70 + iStack_d80) >> auVar108;
  auVar61._12_4_ = iVar118 - (iStack_d6c + iStack_d7c) >> auVar108;
  auVar107 = packssdw(auVar62,auVar61);
  local_3d8 = auVar94._0_2_;
  sStack_3d6 = auVar94._2_2_;
  sStack_3d4 = auVar94._4_2_;
  sStack_3d2 = auVar94._6_2_;
  sStack_3d0 = auVar94._8_2_;
  sStack_3ce = auVar94._10_2_;
  sStack_3cc = auVar94._12_2_;
  sStack_3ca = auVar94._14_2_;
  local_3e8 = auVar96._0_2_;
  sStack_3e6 = auVar96._2_2_;
  sStack_3e4 = auVar96._4_2_;
  sStack_3e2 = auVar96._6_2_;
  sStack_3e0 = auVar96._8_2_;
  sStack_3de = auVar96._10_2_;
  sStack_3dc = auVar96._12_2_;
  sStack_3da = auVar96._14_2_;
  local_3f8 = auVar104._0_2_;
  sStack_3f6 = auVar104._2_2_;
  sStack_3f4 = auVar104._4_2_;
  sStack_3f2 = auVar104._6_2_;
  sStack_3f0 = auVar104._8_2_;
  sStack_3ee = auVar104._10_2_;
  sStack_3ec = auVar104._12_2_;
  sStack_3ea = auVar104._14_2_;
  local_408 = auVar106._0_2_;
  sStack_406 = auVar106._2_2_;
  sStack_404 = auVar106._4_2_;
  sStack_402 = auVar106._6_2_;
  sStack_400 = auVar106._8_2_;
  sStack_3fe = auVar106._10_2_;
  sStack_3fc = auVar106._12_2_;
  sStack_3fa = auVar106._14_2_;
  local_418 = auVar107._0_2_;
  sStack_416 = auVar107._2_2_;
  sStack_414 = auVar107._4_2_;
  sStack_412 = auVar107._6_2_;
  sStack_410 = auVar107._8_2_;
  sStack_40e = auVar107._10_2_;
  sStack_40c = auVar107._12_2_;
  sStack_40a = auVar107._14_2_;
  local_428 = auVar105._0_2_;
  sStack_426 = auVar105._2_2_;
  sStack_424 = auVar105._4_2_;
  sStack_422 = auVar105._6_2_;
  sStack_420 = auVar105._8_2_;
  sStack_41e = auVar105._10_2_;
  sStack_41c = auVar105._12_2_;
  sStack_41a = auVar105._14_2_;
  local_438 = auVar97._0_2_;
  sStack_436 = auVar97._2_2_;
  sStack_434 = auVar97._4_2_;
  sStack_432 = auVar97._6_2_;
  sStack_430 = auVar97._8_2_;
  sStack_42e = auVar97._10_2_;
  sStack_42c = auVar97._12_2_;
  sStack_42a = auVar97._14_2_;
  local_448 = auVar95._0_2_;
  sStack_446 = auVar95._2_2_;
  sStack_444 = auVar95._4_2_;
  sStack_442 = auVar95._6_2_;
  sStack_440 = auVar95._8_2_;
  sStack_43e = auVar95._10_2_;
  sStack_43c = auVar95._12_2_;
  sStack_43a = auVar95._14_2_;
  cVar1 = (0 < local_448) * (local_448 < 0x100) * auVar95[0] - (0xff < local_448);
  cVar2 = (0 < sStack_444) * (sStack_444 < 0x100) * auVar95[4] - (0xff < sStack_444);
  cVar3 = (0 < sStack_440) * (sStack_440 < 0x100) * auVar95[8] - (0xff < sStack_440);
  cVar4 = (0 < sStack_43c) * (sStack_43c < 0x100) * auVar95[0xc] - (0xff < sStack_43c);
  *(ulong *)out =
       CONCAT17(cVar1,CONCAT16((0 < local_438) * (local_438 < 0x100) * auVar97[0] -
                               (0xff < local_438),
                               CONCAT15((0 < local_428) * (local_428 < 0x100) * auVar105[0] -
                                        (0xff < local_428),
                                        CONCAT14((0 < local_418) * (local_418 < 0x100) * auVar107[0]
                                                 - (0xff < local_418),
                                                 CONCAT13((0 < local_408) * (local_408 < 0x100) *
                                                          auVar106[0] - (0xff < local_408),
                                                          CONCAT12((0 < local_3f8) *
                                                                   (local_3f8 < 0x100) * auVar104[0]
                                                                   - (0xff < local_3f8),
                                                                   CONCAT11((0 < local_3e8) *
                                                                            (local_3e8 < 0x100) *
                                                                            auVar96[0] -
                                                                            (0xff < local_3e8),
                                                                            (0 < local_3d8) *
                                                                            (local_3d8 < 0x100) *
                                                                            auVar94[0] -
                                                                            (0xff < local_3d8)))))))
               );
  psVar93 = out + out_stride;
  *(long *)psVar93 =
       (long)(CONCAT18((0 < sStack_446) * (sStack_446 < 0x100) * auVar95[2] - (0xff < sStack_446),
                       CONCAT17((0 < sStack_436) * (sStack_436 < 0x100) * auVar97[2] -
                                (0xff < sStack_436),
                                CONCAT16((0 < sStack_426) * (sStack_426 < 0x100) * auVar105[2] -
                                         (0xff < sStack_426),
                                         CONCAT15((0 < sStack_416) * (sStack_416 < 0x100) *
                                                  auVar107[2] - (0xff < sStack_416),
                                                  CONCAT14((0 < sStack_406) * (sStack_406 < 0x100) *
                                                           auVar106[2] - (0xff < sStack_406),
                                                           CONCAT13((0 < sStack_3f6) *
                                                                    (sStack_3f6 < 0x100) *
                                                                    auVar104[2] -
                                                                    (0xff < sStack_3f6),
                                                                    CONCAT12((0 < sStack_3e6) *
                                                                             (sStack_3e6 < 0x100) *
                                                                             auVar96[2] -
                                                                             (0xff < sStack_3e6),
                                                                             CONCAT11((0 < 
                                                  sStack_3d6) * (sStack_3d6 < 0x100) * auVar94[2] -
                                                  (0xff < sStack_3d6),cVar1)))))))) >> 8);
  psVar93 = psVar93 + out_stride;
  *(ulong *)psVar93 =
       CONCAT17(cVar2,CONCAT16((0 < sStack_434) * (sStack_434 < 0x100) * auVar97[4] -
                               (0xff < sStack_434),
                               CONCAT15((0 < sStack_424) * (sStack_424 < 0x100) * auVar105[4] -
                                        (0xff < sStack_424),
                                        CONCAT14((0 < sStack_414) * (sStack_414 < 0x100) *
                                                 auVar107[4] - (0xff < sStack_414),
                                                 CONCAT13((0 < sStack_404) * (sStack_404 < 0x100) *
                                                          auVar106[4] - (0xff < sStack_404),
                                                          CONCAT12((0 < sStack_3f4) *
                                                                   (sStack_3f4 < 0x100) *
                                                                   auVar104[4] - (0xff < sStack_3f4)
                                                                   ,CONCAT11((0 < sStack_3e4) *
                                                                             (sStack_3e4 < 0x100) *
                                                                             auVar96[4] -
                                                                             (0xff < sStack_3e4),
                                                                             (0 < sStack_3d4) *
                                                                             (sStack_3d4 < 0x100) *
                                                                             auVar94[4] -
                                                                             (0xff < sStack_3d4)))))
                                       )));
  psVar93 = psVar93 + out_stride;
  *(long *)psVar93 =
       (long)(CONCAT18((0 < sStack_442) * (sStack_442 < 0x100) * auVar95[6] - (0xff < sStack_442),
                       CONCAT17((0 < sStack_432) * (sStack_432 < 0x100) * auVar97[6] -
                                (0xff < sStack_432),
                                CONCAT16((0 < sStack_422) * (sStack_422 < 0x100) * auVar105[6] -
                                         (0xff < sStack_422),
                                         CONCAT15((0 < sStack_412) * (sStack_412 < 0x100) *
                                                  auVar107[6] - (0xff < sStack_412),
                                                  CONCAT14((0 < sStack_402) * (sStack_402 < 0x100) *
                                                           auVar106[6] - (0xff < sStack_402),
                                                           CONCAT13((0 < sStack_3f2) *
                                                                    (sStack_3f2 < 0x100) *
                                                                    auVar104[6] -
                                                                    (0xff < sStack_3f2),
                                                                    CONCAT12((0 < sStack_3e2) *
                                                                             (sStack_3e2 < 0x100) *
                                                                             auVar96[6] -
                                                                             (0xff < sStack_3e2),
                                                                             CONCAT11((0 < 
                                                  sStack_3d2) * (sStack_3d2 < 0x100) * auVar94[6] -
                                                  (0xff < sStack_3d2),cVar2)))))))) >> 8);
  psVar93 = psVar93 + out_stride;
  *(ulong *)psVar93 =
       CONCAT17(cVar3,CONCAT16((0 < sStack_430) * (sStack_430 < 0x100) * auVar97[8] -
                               (0xff < sStack_430),
                               CONCAT15((0 < sStack_420) * (sStack_420 < 0x100) * auVar105[8] -
                                        (0xff < sStack_420),
                                        CONCAT14((0 < sStack_410) * (sStack_410 < 0x100) *
                                                 auVar107[8] - (0xff < sStack_410),
                                                 CONCAT13((0 < sStack_400) * (sStack_400 < 0x100) *
                                                          auVar106[8] - (0xff < sStack_400),
                                                          CONCAT12((0 < sStack_3f0) *
                                                                   (sStack_3f0 < 0x100) *
                                                                   auVar104[8] - (0xff < sStack_3f0)
                                                                   ,CONCAT11((0 < sStack_3e0) *
                                                                             (sStack_3e0 < 0x100) *
                                                                             auVar96[8] -
                                                                             (0xff < sStack_3e0),
                                                                             (0 < sStack_3d0) *
                                                                             (sStack_3d0 < 0x100) *
                                                                             auVar94[8] -
                                                                             (0xff < sStack_3d0)))))
                                       )));
  psVar93 = psVar93 + out_stride;
  *(long *)psVar93 =
       (long)(CONCAT18((0 < sStack_43e) * (sStack_43e < 0x100) * auVar95[10] - (0xff < sStack_43e),
                       CONCAT17((0 < sStack_42e) * (sStack_42e < 0x100) * auVar97[10] -
                                (0xff < sStack_42e),
                                CONCAT16((0 < sStack_41e) * (sStack_41e < 0x100) * auVar105[10] -
                                         (0xff < sStack_41e),
                                         CONCAT15((0 < sStack_40e) * (sStack_40e < 0x100) *
                                                  auVar107[10] - (0xff < sStack_40e),
                                                  CONCAT14((0 < sStack_3fe) * (sStack_3fe < 0x100) *
                                                           auVar106[10] - (0xff < sStack_3fe),
                                                           CONCAT13((0 < sStack_3ee) *
                                                                    (sStack_3ee < 0x100) *
                                                                    auVar104[10] -
                                                                    (0xff < sStack_3ee),
                                                                    CONCAT12((0 < sStack_3de) *
                                                                             (sStack_3de < 0x100) *
                                                                             auVar96[10] -
                                                                             (0xff < sStack_3de),
                                                                             CONCAT11((0 < 
                                                  sStack_3ce) * (sStack_3ce < 0x100) * auVar94[10] -
                                                  (0xff < sStack_3ce),cVar3)))))))) >> 8);
  *(ulong *)(psVar93 + out_stride) =
       CONCAT17(cVar4,CONCAT16((0 < sStack_42c) * (sStack_42c < 0x100) * auVar97[0xc] -
                               (0xff < sStack_42c),
                               CONCAT15((0 < sStack_41c) * (sStack_41c < 0x100) * auVar105[0xc] -
                                        (0xff < sStack_41c),
                                        CONCAT14((0 < sStack_40c) * (sStack_40c < 0x100) *
                                                 auVar107[0xc] - (0xff < sStack_40c),
                                                 CONCAT13((0 < sStack_3fc) * (sStack_3fc < 0x100) *
                                                          auVar106[0xc] - (0xff < sStack_3fc),
                                                          CONCAT12((0 < sStack_3ec) *
                                                                   (sStack_3ec < 0x100) *
                                                                   auVar104[0xc] -
                                                                   (0xff < sStack_3ec),
                                                                   CONCAT11((0 < sStack_3dc) *
                                                                            (sStack_3dc < 0x100) *
                                                                            auVar96[0xc] -
                                                                            (0xff < sStack_3dc),
                                                                            (0 < sStack_3cc) *
                                                                            (sStack_3cc < 0x100) *
                                                                            auVar94[0xc] -
                                                                            (0xff < sStack_3cc))))))
                              ));
  *(long *)(psVar93 + out_stride + out_stride) =
       (long)(CONCAT18((0 < sStack_43a) * (sStack_43a < 0x100) * auVar95[0xe] - (0xff < sStack_43a),
                       CONCAT17((0 < sStack_42a) * (sStack_42a < 0x100) * auVar97[0xe] -
                                (0xff < sStack_42a),
                                CONCAT16((0 < sStack_41a) * (sStack_41a < 0x100) * auVar105[0xe] -
                                         (0xff < sStack_41a),
                                         CONCAT15((0 < sStack_40a) * (sStack_40a < 0x100) *
                                                  auVar107[0xe] - (0xff < sStack_40a),
                                                  CONCAT14((0 < sStack_3fa) * (sStack_3fa < 0x100) *
                                                           auVar106[0xe] - (0xff < sStack_3fa),
                                                           CONCAT13((0 < sStack_3ea) *
                                                                    (sStack_3ea < 0x100) *
                                                                    auVar104[0xe] -
                                                                    (0xff < sStack_3ea),
                                                                    CONCAT12((0 < sStack_3da) *
                                                                             (sStack_3da < 0x100) *
                                                                             auVar96[0xe] -
                                                                             (0xff < sStack_3da),
                                                                             CONCAT11((0 < 
                                                  sStack_3ca) * (sStack_3ca < 0x100) * auVar94[0xe]
                                                  - (0xff < sStack_3ca),cVar4)))))))) >> 8);
  return;
}

Assistant:

static void stbi__idct_simd(stbi_uc *out, int out_stride, short data[64])
{
   // This is constructed to match our regular (generic) integer IDCT exactly.
   __m128i row0, row1, row2, row3, row4, row5, row6, row7;
   __m128i tmp;

   // dot product constant: even elems=x, odd elems=y
   #define dct_const(x,y)  _mm_setr_epi16((x),(y),(x),(y),(x),(y),(x),(y))

   // out(0) = c0[even]*x + c0[odd]*y   (c0, x, y 16-bit, out 32-bit)
   // out(1) = c1[even]*x + c1[odd]*y
   #define dct_rot(out0,out1, x,y,c0,c1) \
      __m128i c0##lo = _mm_unpacklo_epi16((x),(y)); \
      __m128i c0##hi = _mm_unpackhi_epi16((x),(y)); \
      __m128i out0##_l = _mm_madd_epi16(c0##lo, c0); \
      __m128i out0##_h = _mm_madd_epi16(c0##hi, c0); \
      __m128i out1##_l = _mm_madd_epi16(c0##lo, c1); \
      __m128i out1##_h = _mm_madd_epi16(c0##hi, c1)

   // out = in << 12  (in 16-bit, out 32-bit)
   #define dct_widen(out, in) \
      __m128i out##_l = _mm_srai_epi32(_mm_unpacklo_epi16(_mm_setzero_si128(), (in)), 4); \
      __m128i out##_h = _mm_srai_epi32(_mm_unpackhi_epi16(_mm_setzero_si128(), (in)), 4)

   // wide add
   #define dct_wadd(out, a, b) \
      __m128i out##_l = _mm_add_epi32(a##_l, b##_l); \
      __m128i out##_h = _mm_add_epi32(a##_h, b##_h)

   // wide sub
   #define dct_wsub(out, a, b) \
      __m128i out##_l = _mm_sub_epi32(a##_l, b##_l); \
      __m128i out##_h = _mm_sub_epi32(a##_h, b##_h)

   // butterfly a/b, add bias, then shift by "s" and pack
   #define dct_bfly32o(out0, out1, a,b,bias,s) \
      { \
         __m128i abiased_l = _mm_add_epi32(a##_l, bias); \
         __m128i abiased_h = _mm_add_epi32(a##_h, bias); \
         dct_wadd(sum, abiased, b); \
         dct_wsub(dif, abiased, b); \
         out0 = _mm_packs_epi32(_mm_srai_epi32(sum_l, s), _mm_srai_epi32(sum_h, s)); \
         out1 = _mm_packs_epi32(_mm_srai_epi32(dif_l, s), _mm_srai_epi32(dif_h, s)); \
      }

   // 8-bit interleave step (for transposes)
   #define dct_interleave8(a, b) \
      tmp = a; \
      a = _mm_unpacklo_epi8(a, b); \
      b = _mm_unpackhi_epi8(tmp, b)

   // 16-bit interleave step (for transposes)
   #define dct_interleave16(a, b) \
      tmp = a; \
      a = _mm_unpacklo_epi16(a, b); \
      b = _mm_unpackhi_epi16(tmp, b)

   #define dct_pass(bias,shift) \
      { \
         /* even part */ \
         dct_rot(t2e,t3e, row2,row6, rot0_0,rot0_1); \
         __m128i sum04 = _mm_add_epi16(row0, row4); \
         __m128i dif04 = _mm_sub_epi16(row0, row4); \
         dct_widen(t0e, sum04); \
         dct_widen(t1e, dif04); \
         dct_wadd(x0, t0e, t3e); \
         dct_wsub(x3, t0e, t3e); \
         dct_wadd(x1, t1e, t2e); \
         dct_wsub(x2, t1e, t2e); \
         /* odd part */ \
         dct_rot(y0o,y2o, row7,row3, rot2_0,rot2_1); \
         dct_rot(y1o,y3o, row5,row1, rot3_0,rot3_1); \
         __m128i sum17 = _mm_add_epi16(row1, row7); \
         __m128i sum35 = _mm_add_epi16(row3, row5); \
         dct_rot(y4o,y5o, sum17,sum35, rot1_0,rot1_1); \
         dct_wadd(x4, y0o, y4o); \
         dct_wadd(x5, y1o, y5o); \
         dct_wadd(x6, y2o, y5o); \
         dct_wadd(x7, y3o, y4o); \
         dct_bfly32o(row0,row7, x0,x7,bias,shift); \
         dct_bfly32o(row1,row6, x1,x6,bias,shift); \
         dct_bfly32o(row2,row5, x2,x5,bias,shift); \
         dct_bfly32o(row3,row4, x3,x4,bias,shift); \
      }